

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O0

void __thiscall floorplan::GraphStatistics::calculateAverageClusterCoeffient(GraphStatistics *this)

{
  double dVar1;
  uint uVar2;
  vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
  *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  vertices_size_type vVar6;
  ostream *poVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  stringstream local_3a8 [8];
  stringstream strs_1;
  undefined1 local_398 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  stringstream local_1d0 [8];
  stringstream strs;
  undefined1 local_1c0 [376];
  pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_float>
  local_48;
  undefined1 local_30 [8];
  pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_double>
  kRes;
  int i;
  int nanvalues;
  GraphStatistics *this_local;
  
  this->_averageClusterCoefficient = 0.0;
  kRes.second._4_4_ = 0;
  kRes.second._0_4_ = 0;
  do {
    uVar9 = (ulong)kRes.second._0_4_;
    pvVar3 = GraphDatabase::getGraphs(this->_database);
    sVar4 = std::
            vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
            ::size(pvVar3);
    if (sVar4 <= uVar9) {
      dVar1 = this->_averageClusterCoefficient;
      pvVar3 = GraphDatabase::getGraphs(this->_database);
      sVar4 = std::
              vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
              ::size(pvVar3);
      lVar10 = sVar4 - (long)kRes.second._4_4_;
      auVar11._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar11._0_8_ = lVar10;
      auVar11._12_4_ = 0x45300000;
      this->_averageClusterCoefficient =
           dVar1 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
      return;
    }
    pvVar3 = GraphDatabase::getGraphs(this->_database);
    pvVar5 = std::
             vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
             ::operator[](pvVar3,(long)kRes.second._0_4_);
    GraphUtils::calculateClusterCoeff(&local_48,pvVar5);
    std::
    pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_double>
    ::
    pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_float,_true>
              ((pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_double>
                *)local_30,&local_48);
    uVar2 = std::isnan((double)kRes.first.m_map._8_8_);
    if ((uVar2 & 1) == 0) {
      if ((double)kRes.first.m_map._8_8_ <= 0.4) {
LAB_0020b411:
        if (((double)kRes.first.m_map._8_8_ == 0.0) && (!NAN((double)kRes.first.m_map._8_8_))) {
          pvVar3 = GraphDatabase::getGraphs(this->_database);
          pvVar5 = std::
                   vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                   ::operator[](pvVar3,(long)kRes.second._0_4_);
          vVar6 = boost::
                  num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                            ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
                              *)pvVar5);
          if (0x14 < vVar6) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Low!");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            pvVar8 = (void *)std::ostream::operator<<(&std::cout,(double)kRes.first.m_map._8_8_);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            if (((double)kRes.first.m_map._8_8_ == 0.0) && (!NAN((double)kRes.first.m_map._8_8_))) {
              std::__cxx11::stringstream::stringstream(local_3a8);
              std::ostream::operator<<(local_398,kRes.second._0_4_);
              std::__cxx11::stringstream::str();
              std::operator+(&local_3c8,"low_",&local_3e8);
              pvVar3 = GraphDatabase::getGraphs(this->_database);
              pvVar5 = std::
                       vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                       ::operator[](pvVar3,(long)kRes.second._0_4_);
              GraphFileOperations::saveGraphToPNG(&local_3c8,pvVar5);
              std::__cxx11::string::~string((string *)&local_3c8);
              std::__cxx11::string::~string((string *)&local_3e8);
              std::__cxx11::stringstream::~stringstream(local_3a8);
            }
          }
        }
      }
      else {
        pvVar3 = GraphDatabase::getGraphs(this->_database);
        pvVar5 = std::
                 vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                 ::operator[](pvVar3,(long)kRes.second._0_4_);
        vVar6 = boost::
                num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                          ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
                            *)pvVar5);
        if (vVar6 < 0x15) goto LAB_0020b411;
        poVar7 = std::operator<<((ostream *)&std::cout,"High!");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pvVar8 = (void *)std::ostream::operator<<(&std::cout,(double)kRes.first.m_map._8_8_);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::stringstream(local_1d0);
        std::ostream::operator<<(local_1c0,kRes.second._0_4_);
        std::__cxx11::stringstream::str();
        std::operator+(&local_200,"high_",&local_220);
        pvVar3 = GraphDatabase::getGraphs(this->_database);
        pvVar5 = std::
                 vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                 ::operator[](pvVar3,(long)kRes.second._0_4_);
        GraphFileOperations::saveGraphToPNG(&local_200,pvVar5);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::stringstream::~stringstream(local_1d0);
      }
      this->_averageClusterCoefficient =
           (double)kRes.first.m_map._8_8_ + this->_averageClusterCoefficient;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(double)kRes.first.m_map._8_8_);
      poVar7 = std::operator<<(poVar7," total ");
      pvVar8 = (void *)std::ostream::operator<<(poVar7,this->_averageClusterCoefficient);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
    else {
      kRes.second._4_4_ = kRes.second._4_4_ + 1;
    }
    kRes.second._0_4_ = kRes.second._0_4_ + 1;
  } while( true );
}

Assistant:

void GraphStatistics::calculateAverageClusterCoeffient()//ExportClusterCoeffDistForCategory(string sFilename, string sCategory)
{
    _averageClusterCoefficient = 0.0;
    int nanvalues = 0;

    for(int i=0; i < _database->getGraphs().size(); i++)
    {
        std::pair<ClusteringMap, double> kRes = GraphUtils::calculateClusterCoeff(_database->getGraphs()[i]);
        if (isnan(kRes.second)){
        nanvalues++;
            continue;
        }
        if( kRes.second > 0.4 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "High!" << endl;
            cout << kRes.second << endl;
            stringstream strs;
            strs << i;
            GraphFileOperations::saveGraphToPNG("high_" + strs.str(), _database->getGraphs()[i]);
        }
        else if( kRes.second == 0 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "Low!" << endl;
            cout << kRes.second << endl;
            if(kRes.second == 0){
                stringstream strs;
                strs << i;
                GraphFileOperations::saveGraphToPNG("low_" + strs.str(), _database->getGraphs()[i]);

            }

        }

        _averageClusterCoefficient += kRes.second;
        cout << kRes.second << " total " << _averageClusterCoefficient << endl;
    }
    _averageClusterCoefficient = _averageClusterCoefficient /  ( _database->getGraphs().size() - nanvalues);
}